

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetUInt32
          (OptionInterpreter *this,int number,uint32_t value,Type type,
          UnknownFieldSet *unknown_fields)

{
  LogMessage *pLVar1;
  LogFinisher local_6d [13];
  LogMessage local_60;
  UnknownFieldSet *local_28;
  UnknownFieldSet *unknown_fields_local;
  uint32_t local_18;
  Type type_local;
  uint32_t value_local;
  int number_local;
  OptionInterpreter *this_local;
  
  local_28 = unknown_fields;
  unknown_fields_local._4_4_ = type;
  local_18 = value;
  type_local = number;
  _value_local = this;
  if (type == TYPE_FIXED32) {
    UnknownFieldSet::AddFixed32(unknown_fields,number,value);
  }
  else if (type == TYPE_UINT32) {
    UnknownFieldSet::AddVarint(unknown_fields,number,(ulong)value);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1e8b);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"Invalid wire type for CPPTYPE_UINT32: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,unknown_fields_local._4_4_);
    internal::LogFinisher::operator=(local_6d,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetUInt32(
    int number, uint32_t value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_UINT32:
      unknown_fields->AddVarint(number, static_cast<uint64_t>(value));
      break;

    case FieldDescriptor::TYPE_FIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32_t>(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_UINT32: " << type;
      break;
  }
}